

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall fixedPreciseMeasurement_ops_Test::TestBody(fixedPreciseMeasurement_ops_Test *this)

{
  unit_data *puVar1;
  unit_data *puVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  double dVar5;
  string local_638;
  AssertHelper local_618;
  Message local_610;
  precise_unit local_608;
  bool local_5f1;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_5c0;
  Message local_5b8;
  bool local_5a9;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_578;
  Message local_570;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__6;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_6;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_4f8;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_4c0 [8];
  fixed_precise_measurement y;
  AssertHelper local_488;
  Message local_480;
  precise_unit local_478;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult gtest_ar__5;
  Message local_448;
  double local_440;
  double local_438;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_408 [8];
  precise_measurement rat;
  AssertHelper local_3d0;
  Message local_3c8;
  precise_unit local_3c0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__4;
  Message local_390;
  double local_388;
  double local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_350 [8];
  fixed_precise_measurement diff;
  AssertHelper local_318;
  Message local_310;
  precise_measurement local_308;
  fixed_precise_measurement local_2f0;
  precise_measurement local_2d8;
  fixed_precise_measurement local_2c0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_270;
  Message local_268;
  precise_unit local_260;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__2;
  Message local_230;
  double local_228;
  double local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_1f0 [8];
  fixed_precise_measurement sum;
  AssertHelper local_1b8;
  Message local_1b0;
  precise_measurement local_1a8;
  precise_measurement local_190;
  precise_measurement local_178;
  precise_measurement local_160;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_110;
  Message local_108;
  precise_unit local_100;
  precise_unit local_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  Message local_c0 [3];
  double local_a8;
  double local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  undefined1 local_70 [8];
  precise_measurement area;
  fixed_precise_measurement d4;
  fixed_precise_measurement d2;
  fixed_precise_measurement d1;
  fixedPreciseMeasurement_ops_Test *this_local;
  
  puVar1 = &d2.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)puVar1,45.0,(precise_unit *)units::precise::m);
  puVar2 = &d4.units_.base_units_;
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)puVar2,79.0,(precise_unit *)units::precise::m);
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)&area.units_.base_units_,1.0,
             (precise_unit *)units::precise::ft);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar.message_,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator*
            ((precise_measurement *)local_70,(fixed_precise_measurement *)puVar1,
             (precise_measurement *)&gtest_ar.message_);
  local_a0 = units::precise_measurement::value((precise_measurement *)local_70);
  local_a8 = 3555.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_98,"area.value()","45.0 * 79",&local_a0,&local_a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar3) {
    testing::Message::Message(local_c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_f0 = units::precise_measurement::units((precise_measurement *)local_70);
  local_100 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::m,(precise_unit *)units::precise::m);
  local_d9 = units::precise_unit::operator==(&local_f0,&local_100);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar3) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_d8,
               (AssertionResult *)"area.units() == precise::m * precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2ad,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  puVar1 = &d4.units_.base_units_;
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_178,(fixed_precise_measurement *)puVar1);
  puVar2 = &d2.units_.base_units_;
  units::fixed_precise_measurement::operator*
            (&local_160,(fixed_precise_measurement *)puVar2,&local_178);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_1a8,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator*
            (&local_190,(fixed_precise_measurement *)puVar1,&local_1a8);
  local_141 = units::precise_measurement::operator==(&local_160,&local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar3) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sum.units_.base_units_,(internal *)local_140,
               (AssertionResult *)"d1 * d2 == d2 * d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2af,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&sum.units_.base_units_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_1.message_,
             (fixed_precise_measurement *)&d4.units_.base_units_);
  units::fixed_precise_measurement::operator+
            ((fixed_precise_measurement *)local_1f0,
             (fixed_precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar_1.message_);
  local_220 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_1f0);
  local_228 = 124.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_218,"sum.value()","45.0 + 79.0",&local_220,&local_228);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar3) {
    testing::Message::Message(&local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_260 = units::fixed_precise_measurement::units((fixed_precise_measurement *)local_1f0);
  local_249 = units::precise_unit::operator==(&local_260,(precise_unit *)units::precise::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar3) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_248,
               (AssertionResult *)"sum.units() == precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  puVar1 = &d4.units_.base_units_;
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_2d8,(fixed_precise_measurement *)puVar1);
  puVar2 = &d2.units_.base_units_;
  units::fixed_precise_measurement::operator+
            (&local_2c0,(fixed_precise_measurement *)puVar2,&local_2d8);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            (&local_308,(fixed_precise_measurement *)puVar2);
  units::fixed_precise_measurement::operator+
            (&local_2f0,(fixed_precise_measurement *)puVar1,&local_308);
  local_2a1 = units::fixed_precise_measurement::operator==(&local_2c0,&local_2f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar3) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&diff.units_.base_units_,(internal *)local_2a0,
               (AssertionResult *)"d1 + d2 == d2 + d1","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&diff.units_.base_units_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_2.message_,
             (fixed_precise_measurement *)&d2.units_.base_units_);
  units::fixed_precise_measurement::operator-
            ((fixed_precise_measurement *)local_350,
             (fixed_precise_measurement *)&d4.units_.base_units_,
             (precise_measurement *)&gtest_ar_2.message_);
  local_380 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_350);
  local_388 = 34.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_378,"diff.value()","79.0 - 45",&local_380,&local_388);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar3) {
    testing::Message::Message(&local_390);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3c0 = units::fixed_precise_measurement::units((fixed_precise_measurement *)local_350);
  local_3a9 = units::precise_unit::operator==(&local_3c0,(precise_unit *)units::precise::m);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar3) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rat.units_.base_units_,(internal *)local_3a8,
               (AssertionResult *)"diff.units() == precise::m","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2b8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    std::__cxx11::string::~string((string *)&rat.units_.base_units_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  units::fixed_precise_measurement::operator_cast_to_precise_measurement
            ((precise_measurement *)&gtest_ar_3.message_,
             (fixed_precise_measurement *)&d4.units_.base_units_);
  units::fixed_precise_measurement::operator/
            ((precise_measurement *)local_408,(fixed_precise_measurement *)&d2.units_.base_units_,
             (precise_measurement *)&gtest_ar_3.message_);
  local_438 = units::precise_measurement::value((precise_measurement *)local_408);
  local_440 = 0.569620253164557;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_430,"rat.value()","45.0 / 79.0",&local_438,&local_440);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar3) {
    testing::Message::Message(&local_448);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,699,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_478 = units::precise_measurement::units((precise_measurement *)local_408);
  local_461 = units::precise_unit::operator==(&local_478,(precise_unit *)units::precise::ratio);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_460,&local_461,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar3) {
    testing::Message::Message(&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&y.units_.base_units_,(internal *)local_460,
               (AssertionResult *)"rat.units() == precise::ratio","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,700,pcVar4);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    std::__cxx11::string::~string((string *)&y.units_.base_units_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  units::operator*((precise_measurement *)&gtest_ar_4.message_,2.0,(precise_unit *)units::precise::m
                  );
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)local_4c0,(precise_measurement *)&gtest_ar_4.message_);
  dVar5 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_4c0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_4e8,"y.value()","2.0",dVar5,2.0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar3) {
    testing::Message::Message(&local_4f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2bf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  units::operator*((precise_measurement *)&gtest_ar_5.message_,5.0,(precise_unit *)units::precise::m
                  );
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)local_4c0,(precise_measurement *)&gtest_ar_5.message_);
  dVar5 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_4c0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_520,"y.value()","5.0",dVar5,5.0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar3) {
    testing::Message::Message(&local_528);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  units::fixed_precise_measurement::operator=((fixed_precise_measurement *)local_4c0,7.0);
  dVar5 = units::fixed_precise_measurement::value((fixed_precise_measurement *)local_4c0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_540,"y.value()","7.0",dVar5,7.0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar3) {
    testing::Message::Message(&local_548);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,&local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_561 = units::is_valid((fixed_precise_measurement *)&d2.units_.base_units_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_560,&local_561,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar3) {
    testing::Message::Message(&local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_560,
               (AssertionResult *)"is_valid(d1)","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  puVar1 = &area.units_.base_units_;
  puVar2 = &d2.units_.base_units_;
  units::fixed_precise_measurement::operator=
            ((fixed_precise_measurement *)puVar1,(fixed_precise_measurement *)puVar2);
  local_5a9 = units::fixed_precise_measurement::operator==
                        ((fixed_precise_measurement *)puVar1,(fixed_precise_measurement *)puVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5a8,&local_5a9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar3) {
    testing::Message::Message(&local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_5a8,(AssertionResult *)"d4 == d1",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  local_608 = units::fixed_precise_measurement::units
                        ((fixed_precise_measurement *)&area.units_.base_units_);
  local_5f1 = units::precise_unit::operator==(&local_608,(precise_unit *)units::precise::ft);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f0,&local_5f1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar3) {
    testing::Message::Message(&local_610);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_638,(internal *)local_5f0,(AssertionResult *)"d4.units() == precise::ft",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x2c8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_618,&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    std::__cxx11::string::~string((string *)&local_638);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, ops)
{
    fixed_precise_measurement d1(45.0, precise::m);
    fixed_precise_measurement d2(79, precise::m);
    fixed_precise_measurement d4(1.0, precise::ft);
    auto area = d1 * d2;
    EXPECT_EQ(area.value(), 45.0 * 79);
    EXPECT_TRUE(area.units() == precise::m * precise::m);

    EXPECT_TRUE(d1 * d2 == d2 * d1);

    auto sum = d1 + d2;
    EXPECT_EQ(sum.value(), 45.0 + 79.0);
    EXPECT_TRUE(sum.units() == precise::m);
    EXPECT_TRUE(d1 + d2 == d2 + d1);

    auto diff = d2 - d1;
    EXPECT_EQ(diff.value(), 79.0 - 45);
    EXPECT_TRUE(diff.units() == precise::m);

    auto rat = d1 / d2;
    EXPECT_EQ(rat.value(), 45.0 / 79.0);
    EXPECT_TRUE(rat.units() == precise::ratio);

    fixed_precise_measurement y(2.0 * precise::m);
    EXPECT_DOUBLE_EQ(y.value(), 2.0);
    y = 5.0 * precise::m;
    EXPECT_DOUBLE_EQ(y.value(), 5.0);
    y = 7.0;
    EXPECT_DOUBLE_EQ(y.value(), 7.0);
    EXPECT_TRUE(is_valid(d1));

    d4 = d1;
    EXPECT_TRUE(d4 == d1);
    EXPECT_TRUE(d4.units() == precise::ft);
}